

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

matrix2d * __thiscall tinyusdz::value::matrix2d::operator=(matrix2d *this,matrix2f *src)

{
  matrix2d *pmVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  pmVar1 = this;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (*(double (*) [2])*(double (*) [2])this)[lVar3] =
           (double)(*(float (*) [2])*(float (*) [2])src)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    src = (matrix2f *)((long)src + 8);
    this = (matrix2d *)((long)this + 0x10);
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  return pmVar1;
}

Assistant:

matrix2d &matrix2d::operator=(const matrix2f &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}